

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

CService * __thiscall HTTPRequest::GetPeer(CService *__return_storage_ptr__,HTTPRequest *this)

{
  uint16_t portDefault;
  long lVar1;
  long in_FS_OFFSET;
  uint16_t port;
  char *address;
  DNSLookupFn in_stack_ffffffffffffff38;
  allocator<char> local_9b;
  uint16_t local_9a;
  char *local_98;
  string local_90;
  CService local_70;
  CService local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = evhttp_request_get_connection(this->req);
  CService::CService(__return_storage_ptr__);
  if (lVar1 != 0) {
    local_98 = "";
    local_9a = 0;
    evhttp_connection_get_peer(lVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_98,&local_9b);
    portDefault = local_9a;
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&stack0xffffffffffffff40,&g_dns_lookup_abi_cxx11_);
    LookupNumeric(&local_70,&local_90,portDefault,in_stack_ffffffffffffff38);
    MaybeFlipIPv6toCJDNS(&local_48,&local_70);
    CService::operator=(__return_storage_ptr__,&local_48);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_48);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff40);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CService HTTPRequest::GetPeer() const
{
    evhttp_connection* con = evhttp_request_get_connection(req);
    CService peer;
    if (con) {
        // evhttp retains ownership over returned address string
        const char* address = "";
        uint16_t port = 0;

#ifdef HAVE_EVHTTP_CONNECTION_GET_PEER_CONST_CHAR
        evhttp_connection_get_peer(con, &address, &port);
#else
        evhttp_connection_get_peer(con, (char**)&address, &port);
#endif // HAVE_EVHTTP_CONNECTION_GET_PEER_CONST_CHAR

        peer = MaybeFlipIPv6toCJDNS(LookupNumeric(address, port));
    }
    return peer;
}